

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O2

void __thiscall
VariationalBayesEstimatorOnLDA::updateHyperParameters(VariationalBayesEstimatorOnLDA *this)

{
  vector<double,_std::allocator<double>_> *__x;
  ulong uVar1;
  long lVar2;
  int d_1;
  ulong uVar3;
  int d;
  ulong uVar4;
  int k;
  type tVar5;
  type tVar6;
  double dVar7;
  double local_38;
  
  local_38 = 0.0;
  for (uVar4 = 0; uVar1 = (ulong)this->_D, uVar4 < uVar1; uVar4 = uVar4 + 1) {
    tVar5 = boost::math::digamma<double>
                      ((this->_nd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar4] + this->_alphaSum);
    tVar6 = boost::math::digamma<double>(this->_alphaSum);
    local_38 = local_38 + (tVar5 - tVar6);
  }
  __x = &this->_alpha;
  for (uVar4 = 0; uVar4 < this->_K; uVar4 = uVar4 + 1) {
    dVar7 = 0.0;
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      tVar5 = boost::math::digamma<double>
                        (*(double *)
                          (*(long *)((long)&(((this->_ndk).
                                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data._M_start + lVar2) +
                          uVar4 * 8) +
                         (this->_alpha).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar4]);
      tVar6 = boost::math::digamma<double>
                        ((__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar4]);
      dVar7 = dVar7 + (tVar5 - tVar6) *
                      (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar4];
      uVar1 = (ulong)this->_D;
      lVar2 = lVar2 + 0x18;
    }
    (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start[uVar4] = dVar7 / local_38;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::push_back(&this->_alphaTimeSeries,__x);
  (*this->_vptr_VariationalBayesEstimatorOnLDA[8])(this,0);
  (*this->_vptr_VariationalBayesEstimatorOnLDA[5])(this);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::updateHyperParameters(){//{{{
    double denominator = 0;
    for(int d=0;d<_D;d++){
        denominator += boost::math::digamma(_nd[d]+_alphaSum) - boost::math::digamma(_alphaSum);
    }
    for(int k=0;k<_K;k++){
        double numerator = 0;
        for(int d=0;d<_D;d++){
            //ndk == 0 -> alphak == 0  digamma(0) - digamma(0) = 0
            try{
                numerator += (boost::math::digamma(_ndk[d][k]+_alpha[k]) - boost::math::digamma(_alpha[k])) * _alpha[k];
            }catch(...){
                numerator += 0;
            }
        }
        _alpha[k] = numerator / denominator;
    }
    _alphaTimeSeries.push_back(_alpha);
    this->updateBeta(SYMMETRY);
    this->calculateHyperParamSum();
}